

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int read_auth_file(mg_file *filep,read_auth_file_struct *workdata,int depth)

{
  int iVar1;
  char *pcVar2;
  ushort **ppuVar3;
  char local_88 [8];
  char md5 [33];
  size_t local_58;
  size_t l;
  mg_file fp;
  int is_authorized;
  int depth_local;
  read_auth_file_struct *workdata_local;
  mg_file *filep_local;
  
  fp.access.fp._0_4_ = 0;
  if (((filep == (mg_file *)0x0) || (workdata == (read_auth_file_struct *)0x0)) ||
     (fp.access.fp._4_4_ = depth, depth == 0)) {
    filep_local._4_4_ = 0;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            do {
              pcVar2 = mg_fgets(workdata->buf,0x228,filep);
              if (pcVar2 == (char *)0x0) {
                return (int)fp.access.fp;
              }
              local_58 = strlen(workdata->buf);
              while ((local_58 != 0 &&
                     ((ppuVar3 = __ctype_b_loc(),
                      ((*ppuVar3)[(int)(uint)(byte)workdata->buf[local_58 - 1]] & 0x2000) != 0 ||
                      (ppuVar3 = __ctype_b_loc(),
                      ((*ppuVar3)[(int)(uint)(byte)workdata->buf[local_58 - 1]] & 2) != 0))))) {
                workdata->buf[local_58 - 1] = '\0';
                local_58 = local_58 - 1;
              }
            } while (local_58 == 0);
            workdata->f_user = workdata->buf;
            if (*workdata->f_user != ':') break;
            if (workdata->f_user[1] != '#') {
              iVar1 = strncmp(workdata->f_user + 1,"include=",8);
              if (iVar1 == 0) {
                iVar1 = mg_fopen(workdata->conn,workdata->f_user + 9,1,(mg_file *)&l);
                if (iVar1 == 0) {
                  mg_cry_internal_wrap
                            (workdata->conn,(mg_context *)0x0,"read_auth_file",0x2255,
                             "%s: cannot open authorization file: %s","read_auth_file",workdata->buf
                            );
                }
                else {
                  fp.access.fp._0_4_ =
                       read_auth_file((mg_file *)&l,workdata,fp.access.fp._4_4_ + -1);
                  mg_fclose((mg_file_access *)&fp.stat.location);
                  if ((int)fp.access.fp != 0) {
                    return (int)fp.access.fp;
                  }
                }
              }
              else {
                mg_cry_internal_wrap
                          (workdata->conn,(mg_context *)0x0,"read_auth_file",0x225e,
                           "%s: syntax error in authorization file: %s","read_auth_file",
                           workdata->buf);
              }
            }
          }
          pcVar2 = strchr(workdata->f_user,0x3a);
          workdata->f_domain = pcVar2;
          if (workdata->f_domain != (char *)0x0) break;
          mg_cry_internal_wrap
                    (workdata->conn,(mg_context *)0x0,"read_auth_file",0x2267,
                     "%s: syntax error in authorization file: %s","read_auth_file",workdata->buf);
        }
        *workdata->f_domain = '\0';
        workdata->f_domain = workdata->f_domain + 1;
        pcVar2 = strchr(workdata->f_domain,0x3a);
        workdata->f_ha1 = pcVar2;
        if (workdata->f_ha1 != (char *)0x0) break;
        mg_cry_internal_wrap
                  (workdata->conn,(mg_context *)0x0,"read_auth_file",0x2272,
                   "%s: syntax error in authorization file: %s","read_auth_file",workdata->buf);
      }
      *workdata->f_ha1 = '\0';
      workdata->f_ha1 = workdata->f_ha1 + 1;
      iVar1 = strcmp((workdata->ah).user,workdata->f_user);
    } while ((iVar1 != 0) || (iVar1 = strcmp(workdata->domain,workdata->f_domain), iVar1 != 0));
    iVar1 = (workdata->ah).type;
    if (iVar1 == 1) {
      mg_md5(local_88,workdata->f_user,":",workdata->domain,":",(workdata->ah).plain_password,0);
      iVar1 = memcmp(workdata->f_ha1,local_88,0x21);
      filep_local._4_4_ = (uint)(iVar1 == 0);
    }
    else if (iVar1 == 2) {
      filep_local._4_4_ =
           check_password_digest
                     ((workdata->conn->request_info).request_method,workdata->f_ha1,
                      (workdata->ah).uri,(workdata->ah).nonce,(workdata->ah).nc,
                      (workdata->ah).cnonce,(workdata->ah).qop,(workdata->ah).response);
    }
    else {
      filep_local._4_4_ = 0;
    }
  }
  return filep_local._4_4_;
}

Assistant:

static int
read_auth_file(struct mg_file *filep,
               struct read_auth_file_struct *workdata,
               int depth)
{
	int is_authorized = 0;
	struct mg_file fp;
	size_t l;

	if (!filep || !workdata || (0 == depth)) {
		return 0;
	}

	/* Loop over passwords file */
	while (mg_fgets(workdata->buf, sizeof(workdata->buf), filep) != NULL) {
		l = strlen(workdata->buf);
		while (l > 0) {
			if (isspace((unsigned char)workdata->buf[l - 1])
			    || iscntrl((unsigned char)workdata->buf[l - 1])) {
				l--;
				workdata->buf[l] = 0;
			} else
				break;
		}
		if (l < 1) {
			continue;
		}

		workdata->f_user = workdata->buf;

		if (workdata->f_user[0] == ':') {
			/* user names may not contain a ':' and may not be empty,
			 * so lines starting with ':' may be used for a special purpose
			 */
			if (workdata->f_user[1] == '#') {
				/* :# is a comment */
				continue;
			} else if (!strncmp(workdata->f_user + 1, "include=", 8)) {
				if (mg_fopen(workdata->conn,
				             workdata->f_user + 9,
				             MG_FOPEN_MODE_READ,
				             &fp)) {
					is_authorized = read_auth_file(&fp, workdata, depth - 1);
					(void)mg_fclose(
					    &fp.access); /* ignore error on read only file */

					/* No need to continue processing files once we have a
					 * match, since nothing will reset it back
					 * to 0.
					 */
					if (is_authorized) {
						return is_authorized;
					}
				} else {
					mg_cry_internal(workdata->conn,
					                "%s: cannot open authorization file: %s",
					                __func__,
					                workdata->buf);
				}
				continue;
			}
			/* everything is invalid for the moment (might change in the
			 * future) */
			mg_cry_internal(workdata->conn,
			                "%s: syntax error in authorization file: %s",
			                __func__,
			                workdata->buf);
			continue;
		}

		workdata->f_domain = strchr(workdata->f_user, ':');
		if (workdata->f_domain == NULL) {
			mg_cry_internal(workdata->conn,
			                "%s: syntax error in authorization file: %s",
			                __func__,
			                workdata->buf);
			continue;
		}
		*(char *)(workdata->f_domain) = 0;
		(workdata->f_domain)++;

		workdata->f_ha1 = strchr(workdata->f_domain, ':');
		if (workdata->f_ha1 == NULL) {
			mg_cry_internal(workdata->conn,
			                "%s: syntax error in authorization file: %s",
			                __func__,
			                workdata->buf);
			continue;
		}
		*(char *)(workdata->f_ha1) = 0;
		(workdata->f_ha1)++;

		if (!strcmp(workdata->ah.user, workdata->f_user)
		    && !strcmp(workdata->domain, workdata->f_domain)) {
			switch (workdata->ah.type) {
			case 1: /* Basic */
			{
				char md5[33];
				mg_md5(md5,
				       workdata->f_user,
				       ":",
				       workdata->domain,
				       ":",
				       workdata->ah.plain_password,
				       NULL);
				return 0 == memcmp(workdata->f_ha1, md5, 33);
			}
			case 2: /* Digest */
				return check_password_digest(
				    workdata->conn->request_info.request_method,
				    workdata->f_ha1,
				    workdata->ah.uri,
				    workdata->ah.nonce,
				    workdata->ah.nc,
				    workdata->ah.cnonce,
				    workdata->ah.qop,
				    workdata->ah.response);
			default: /* None/Other/Unknown */
				return 0;
			}
		}
	}

	return is_authorized;
}